

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# validate_ray_query.cpp
# Opt level: O0

uint32_t spvtools::val::anon_unknown_2::GetArrayLength(ValidationState_t *_,Instruction *array_type)

{
  Op OVar1;
  uint id;
  Instruction *this;
  uint local_2c;
  uint32_t array_length;
  Instruction *array_length_inst;
  uint32_t const_int_id;
  Instruction *array_type_local;
  ValidationState_t *__local;
  
  OVar1 = val::Instruction::opcode(array_type);
  if (OVar1 == OpTypeArray) {
    id = val::Instruction::GetOperandAs<unsigned_int>(array_type,2);
    this = ValidationState_t::FindDef(_,id);
    local_2c = 0;
    OVar1 = val::Instruction::opcode(this);
    if (OVar1 == OpConstant) {
      local_2c = val::Instruction::GetOperandAs<unsigned_int>(this,2);
    }
    return local_2c;
  }
  __assert_fail("array_type->opcode() == spv::Op::OpTypeArray",
                "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/ThirdParty/SPIRV-Tools/source/val/validate_ray_query.cpp"
                ,0x1b,
                "uint32_t spvtools::val::(anonymous namespace)::GetArrayLength(ValidationState_t &, const Instruction *)"
               );
}

Assistant:

uint32_t GetArrayLength(ValidationState_t& _, const Instruction* array_type) {
  assert(array_type->opcode() == spv::Op::OpTypeArray);
  uint32_t const_int_id = array_type->GetOperandAs<uint32_t>(2U);
  Instruction* array_length_inst = _.FindDef(const_int_id);
  uint32_t array_length = 0;
  if (array_length_inst->opcode() == spv::Op::OpConstant) {
    array_length = array_length_inst->GetOperandAs<uint32_t>(2);
  }
  return array_length;
}